

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_element(p_ply ply)

{
  int iVar1;
  bool bVar2;
  undefined8 local_28;
  long dummy;
  p_ply_element_conflict element;
  p_ply ply_local;
  
  dummy = 0;
  element = (p_ply_element_conflict)ply;
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    iVar1 = strcmp(ply->buffer + ply->buffer_token,"element");
    if (iVar1 == 0) {
      dummy = (long)ply_grow_element((p_ply)element);
      if ((p_ply_element_conflict)dummy == (p_ply_element_conflict)0x0) {
        ply_local._4_4_ = 0;
      }
      else {
        iVar1 = ply_read_word((p_ply)element);
        if (iVar1 == 0) {
          ply_local._4_4_ = 0;
        }
        else {
          strcpy((char *)dummy,element->name + *(long *)(element[0x1d].name + 0x98) + 0x48);
          iVar1 = ply_read_word((p_ply)element);
          if (iVar1 == 0) {
            ply_local._4_4_ = 0;
          }
          else {
            iVar1 = __isoc99_sscanf(element->name + *(long *)(element[0x1d].name + 0x98) + 0x48,
                                    "%ld",&local_28);
            if (iVar1 == 1) {
              *(undefined8 *)(dummy + 0x100) = local_28;
              iVar1 = ply_read_word((p_ply)element);
              if (iVar1 == 0) {
                ply_local._4_4_ = 0;
              }
              else {
                do {
                  iVar1 = ply_read_header_property((p_ply)element);
                  bVar2 = true;
                  if (iVar1 == 0) {
                    iVar1 = ply_read_header_comment((p_ply)element);
                    bVar2 = true;
                    if (iVar1 == 0) {
                      iVar1 = ply_read_header_obj_info((p_ply)element);
                      bVar2 = iVar1 != 0;
                    }
                  }
                } while (bVar2);
                ply_local._4_4_ = 1;
              }
            }
            else {
              ply_ferror((p_ply)element,"Expected number got \'%s\'",
                         element->name + *(long *)(element[0x1d].name + 0x98) + 0x48);
              ply_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      ply_local._4_4_ = 0;
    }
    return ply_local._4_4_;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x4ee,"int ply_read_header_element(p_ply)");
}

Assistant:

static int ply_read_header_element(p_ply ply) {
    p_ply_element element = NULL;
    long dummy;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "element")) return 0;
    /* allocate room for new element */
    element = ply_grow_element(ply);
    if (!element) return 0;
    /* get element name */
    if (!ply_read_word(ply)) return 0;
    strcpy(element->name, BWORD(ply));
    /* get number of elements of this type */
    if (!ply_read_word(ply)) return 0;
    if (sscanf(BWORD(ply), "%ld", &dummy) != 1) {
        ply_ferror(ply, "Expected number got '%s'", BWORD(ply));
        return 0;
    }
    element->ninstances = dummy;
    /* get all properties for this element */
    if (!ply_read_word(ply)) return 0;
    while (ply_read_header_property(ply) ||
        ply_read_header_comment(ply) || ply_read_header_obj_info(ply))
        /* do nothing */;
    return 1;
}